

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquery.cpp
# Opt level: O0

bool __thiscall QSqlQuery::isNull(QSqlQuery *this,QAnyStringView name)

{
  QAnyStringView name_00;
  bool bVar1;
  int iVar2;
  QMessageLogger *file;
  undefined8 uVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  qsizetype index;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff70;
  QMessageLogger *this_00;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *pQVar4;
  bool local_79;
  QString local_78;
  char local_60 [32];
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_30 [8];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  local_28 = in_RSI;
  local_20 = in_RDX;
  (**(code **)(*(long *)&((((((QExplicitlySharedDataPointer<QSqlRecordPrivate> *)&in_RDI->category)
                            ->d).ptr)->fields).d.d)->super_QArrayData + 0xc0))(local_30);
  local_40 = local_28;
  local_38 = local_20;
  name_00.m_size = (size_t)pQVar4;
  name_00.field_0.m_data = in_stack_ffffffffffffff70.m_data;
  iVar2 = QSqlRecord::indexOf((QSqlRecord *)in_RDI,name_00);
  file = (QMessageLogger *)(long)iVar2;
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x138a1f);
  if ((long)file < 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    this_00 = file;
    lcSqlQuery();
    anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
              (in_RDI,(QLoggingCategory *)
                      CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_cb9f0::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x138aa0);
      QMessageLogger::QMessageLogger
                (this_00,(char *)file,(int)((ulong)in_RDI >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (char *)0x138ab6);
      QAnyStringView::toString((QAnyStringView *)in_RDI);
      QtPrivate::asString(&local_78);
      uVar3 = QString::utf16();
      QMessageLogger::warning(local_60,"QSqlQuery::isNull: unknown field name \'%ls\'",uVar3);
      QString::~QString((QString *)0x138afa);
      local_10 = local_10 & 0xffffffffffffff00;
    }
    local_79 = true;
  }
  else {
    local_79 = isNull((QSqlQuery *)in_RDI,in_stack_ffffffffffffff5c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_79;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQuery::isNull(QAnyStringView name) const
{
    qsizetype index = d->sqlResult->record().indexOf(name);
    if (index > -1)
        return isNull(index);
    qCWarning(lcSqlQuery, "QSqlQuery::isNull: unknown field name '%ls'", qUtf16Printable(name.toString()));
    return true;
}